

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_catalog.cpp
# Opt level: O2

void __thiscall duckdb::DuckCatalog::~DuckCatalog(DuckCatalog *this)

{
  ~DuckCatalog(this);
  operator_delete(this);
  return;
}

Assistant:

DuckCatalog::~DuckCatalog() {
}